

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operation.cpp
# Opt level: O1

ptr<Value> __thiscall
Operation::asIntegers(Operation *this,longlong leftOperand,longlong rightOperand)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  undefined8 local_58;
  undefined8 uStack_50;
  string local_40;
  
  puVar5 = (undefined4 *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Operation not defined for Integer type","");
  ExceptionObjects::undefined_operation((ExceptionObjects *)&local_58,&local_40);
  uVar1 = (undefined4)local_58;
  uVar2 = local_58._4_4_;
  uVar3 = (undefined4)uStack_50;
  uVar4 = uStack_50._4_4_;
  local_58 = 0;
  uStack_50 = 0;
  *puVar5 = uVar1;
  puVar5[1] = uVar2;
  puVar5[2] = uVar3;
  puVar5[3] = uVar4;
  __cxa_throw(puVar5,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> Operation::asIntegers(long long int leftOperand, long long int rightOperand) {
    throw ThrowPacket(ExceptionObjects::undefined_operation("Operation not defined for Integer type"));
}